

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O1

int __thiscall units::detail::unit_data::unit_type_count(unit_data *this)

{
  unit_data uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  uVar1 = *this;
  auVar3._0_4_ = -(uint)(((uint)uVar1 & 0xc000) != 0);
  auVar3._4_4_ = -(uint)(((uint)uVar1 & 0x70000) != 0);
  auVar3._8_4_ = -(uint)(((uint)uVar1 & 0x180000) != 0);
  auVar3._12_4_ = -(uint)(((uint)uVar1 & 0xe00000) != 0);
  auVar2._0_4_ = -(uint)(((uint)uVar1 & 0xf) != 0);
  auVar2._4_4_ = -(uint)(((uint)uVar1 & 0xf0) != 0);
  auVar2._8_4_ = -(uint)(((uint)uVar1 & 0x700) != 0);
  auVar2._12_4_ = -(uint)(((uint)uVar1 & 0x3800) != 0);
  auVar3 = packssdw(auVar2,auVar3);
  auVar3 = packsswb(auVar3,auVar3);
  return (((((uint)(byte)(SUB161(auVar3 >> 7,0) & 1 | (SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                          (SUB161(auVar3 >> 0x17,0) & 1) << 2 | (SUB161(auVar3 >> 0x1f,0) & 1) << 3
                          | (SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                          (SUB161(auVar3 >> 0x2f,0) & 1) << 5 | (SUB161(auVar3 >> 0x37,0) & 1) << 6
                         | SUB161(auVar3 >> 0x3f,0) << 7) * 0x8040201 >> 3 & 0x11111111) *
            0x11111111 >> 0x1c) - (uint)(((uint)uVar1 & 0x3000000) == 0)) + 2) -
         (uint)(((uint)uVar1 & 0xc000000) == 0);
}

Assistant:

constexpr int unit_type_count() const
        {
            return ((meter_ != 0) ? 1 : 0) + ((second_ != 0) ? 1 : 0) +
                ((kilogram_ != 0) ? 1 : 0) + ((ampere_ != 0) ? 1 : 0) +
                ((candela_ != 0) ? 1 : 0) + ((kelvin_ != 0) ? 1 : 0) +
                ((mole_ != 0) ? 1 : 0) + ((radians_ != 0) ? 1 : 0) +
                ((currency_ != 0) ? 1 : 0) + ((count_ != 0) ? 1 : 0);
        }